

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  s3senid_t *psVar4;
  undefined8 uVar5;
  glist_t pgVar6;
  s3cipid_t sVar7;
  int iVar8;
  int iVar9;
  mdef_t *pmVar10;
  FILE *__stream;
  char *pcVar11;
  hash_table_t *phVar12;
  ciphone_t *pcVar13;
  phone_t *ppVar14;
  s3senid_t **ppsVar15;
  s3senid_t *psVar16;
  ph_lc_t ***ppppVar17;
  char *pcVar18;
  s3cipid_t *__s;
  void *pvVar19;
  glist_t g;
  int32 iVar20;
  ulong uVar21;
  size_t len;
  s3pid_t sVar22;
  s3cipid_t *psVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  word_posn_t wpos;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  void *val;
  uint size;
  undefined1 auVar31 [16];
  int32 wlen;
  int32 n;
  char buf [1024];
  char tag [1024];
  undefined4 uVar32;
  int local_c6c;
  mdef_t *local_c68;
  hash_table_t *local_c60;
  uint local_c58;
  s3cipid_t local_c52;
  long local_c50;
  uint local_c44;
  char *local_c40;
  char local_c38 [1024];
  undefined8 local_838;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  
  if (mdeffile == (char *)0x0) {
    pcVar11 = "No mdef-file\n";
    lVar24 = 0x2a8;
LAB_00115ac2:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar24,pcVar11);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2ab,"Reading model definition: %s\n",mdeffile);
    }
    pmVar10 = (mdef_t *)
              __ckd_calloc__(1,0x68,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                             ,0x2ad);
    __stream = fopen(mdeffile,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                     ,0x2b0,"fopen(%s,r) failed\n",mdeffile);
      goto LAB_00115aa5;
    }
    do {
      pcVar11 = fgets(local_c38,0x400,__stream);
      if (pcVar11 == (char *)0x0) break;
    } while (local_c38[0] == '#');
    if (pcVar11 == (char *)0x0) {
      pcVar11 = "Empty file: %s\n";
      lVar24 = 0x2b3;
    }
    else {
      local_c60 = (hash_table_t *)mdeffile;
      if (local_c38[2] != '3' || (short)local_c38._0_4_ != 0x2e30) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x2b7,"Version error: Expecing %s, but read %s\n","0.3",local_c38);
        goto LAB_00115aa5;
      }
      pmVar10->n_ci_sen = -1;
      pmVar10->n_sen = -1;
      pmVar10->n_tmat = -1;
      uVar30 = 0xffffffff;
      uVar28 = 0xffffffff;
      uVar25 = 0xffffffff;
      local_c68 = pmVar10;
LAB_0011504c:
      do {
        do {
          pcVar11 = fgets(local_c38,0x400,__stream);
          if (pcVar11 != (char *)0x0) {
            if (local_c38[0] == '#') goto LAB_0011504c;
          }
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "Incomplete header\n";
            lVar24 = 0x2c2;
            goto LAB_00115ac2;
          }
          iVar8 = __isoc99_sscanf(local_c38,"%d %s",&local_c44,&local_438);
          pmVar10 = local_c68;
          if ((iVar8 != 2) || ((int)local_c44 < 0)) {
            pcVar11 = "Error in header: %s\n";
            mdeffile = local_c38;
            lVar24 = 0x2c5;
            goto LAB_00115a9e;
          }
          size = local_c44;
          uVar29 = uVar28;
          uVar26 = uVar25;
          if (((CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) !=
                0x657361 ||
                CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) !=
                0x61625f6e) &&
              (size = uVar30, uVar29 = local_c44,
              CONCAT11(cStack_433,cStack_434) != 0x69 ||
              CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) != 0x72745f6e
              )) && (uVar29 = uVar28, uVar26 = local_c44,
                    CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                    0x70616d ||
                    CONCAT17(cStack_431,
                             CONCAT16(cStack_432,
                                      CONCAT15(cStack_433,
                                               CONCAT14(cStack_434,
                                                        CONCAT13(cStack_435,
                                                                 CONCAT12(cStack_436,
                                                                          CONCAT11(cStack_437,
                                                                                   local_438)))))))
                    != 0x5f65746174735f6e)) {
            auVar31[0] = -(local_438 == 'n');
            auVar31[1] = -(cStack_437 == '_');
            auVar31[2] = -(cStack_436 == 't');
            auVar31[3] = -(cStack_435 == 'i');
            auVar31[4] = -(cStack_434 == 'e');
            auVar31[5] = -(cStack_433 == 'd');
            auVar31[6] = -(cStack_432 == '_');
            auVar31[7] = -(cStack_431 == 'c');
            auVar31[8] = -(cStack_430 == 'i');
            auVar31[9] = -(cStack_42f == '_');
            auVar31[10] = -(cStack_42e == 's');
            auVar31[0xb] = -(cStack_42d == 't');
            auVar31[0xc] = -(cStack_42c == 'a');
            auVar31[0xd] = -(cStack_42b == 't');
            auVar31[0xe] = -(cStack_42a == 'e');
            auVar31[0xf] = -(cStack_429 == '\0');
            if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
              local_c68->n_ci_sen = local_c44;
              uVar26 = uVar25;
            }
            else if (CONCAT17(cStack_42c,
                              CONCAT16(cStack_42d,
                                       CONCAT15(cStack_42e,
                                                CONCAT14(cStack_42f,
                                                         CONCAT13(cStack_430,
                                                                  CONCAT12(cStack_431,
                                                                           CONCAT11(cStack_432,
                                                                                    cStack_433))))))
                             ) == 0x65746174735f64 &&
                     CONCAT17(cStack_431,
                              CONCAT16(cStack_432,
                                       CONCAT15(cStack_433,
                                                CONCAT14(cStack_434,
                                                         CONCAT13(cStack_435,
                                                                  CONCAT12(cStack_436,
                                                                           CONCAT11(cStack_437,
                                                                                    local_438)))))))
                     == 0x735f646569745f6e) {
              local_c68->n_sen = local_c44;
              uVar26 = uVar25;
            }
            else {
              if (CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                  0x74616d ||
                  CONCAT17(cStack_431,
                           CONCAT16(cStack_432,
                                    CONCAT15(cStack_433,
                                             CONCAT14(cStack_434,
                                                      CONCAT13(cStack_435,
                                                               CONCAT12(cStack_436,
                                                                        CONCAT11(cStack_437,
                                                                                 local_438))))))) !=
                  0x745f646569745f6e) {
                pcVar11 = "Unknown header line: %s\n";
                mdeffile = local_c38;
                lVar24 = 0x2d4;
                goto LAB_00115a9e;
              }
              local_c68->n_tmat = local_c44;
              uVar26 = uVar25;
            }
          }
          uVar30 = size;
          uVar28 = uVar29;
          uVar25 = uVar26;
        } while (((int)(size | uVar29 | uVar26) < 0) || (iVar8 = local_c68->n_ci_sen, iVar8 < 0));
        uVar2 = local_c68->n_sen;
        uVar21 = (ulong)uVar2;
      } while (((int)uVar2 < 0) || (uVar3 = local_c68->n_tmat, (int)uVar3 < 0));
      if ((((iVar8 <= (int)uVar2) && (size != 0)) && (iVar8 != 0)) && (uVar3 != 0)) {
        if ((int)size < 0x7fff) {
          uVar29 = uVar29 + size;
          if ((int)uVar29 < 0x7ffffffe) {
            if ((int)uVar2 < 0x7ffe) {
              local_c58 = size;
              if ((int)uVar3 < 0x7ffffffe) {
                local_c68->n_emit_state = uVar26 / uVar29 - 1;
                if ((uVar26 / uVar29) * uVar29 == uVar26) {
                  local_c68->n_ciphone = size;
                  pcVar11 = (char *)0x0;
                  phVar12 = hash_table_new(size,0);
                  pmVar10->ciphone_ht = phVar12;
                  local_c40 = (char *)(ulong)size;
                  pcVar13 = (ciphone_t *)
                            __ckd_calloc__((size_t)local_c40,0x10,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x2f2);
                  pmVar10->ciphone = pcVar13;
                  pmVar10->n_phone = uVar29;
                  ppVar14 = (phone_t *)
                            __ckd_calloc__((ulong)uVar29,0x20,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x2f6);
                  pmVar10->phone = ppVar14;
                  ppsVar15 = (s3senid_t **)
                             __ckd_calloc_2d__((long)pmVar10->n_phone,(long)pmVar10->n_emit_state,2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                               ,0x2f9);
                  pmVar10->sseq = ppsVar15;
                  psVar16 = (s3senid_t *)
                            __ckd_calloc__((long)pmVar10->n_emit_state * (long)pmVar10->n_phone,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x30d);
                  pmVar10->st2senmap = psVar16;
                  iVar8 = pmVar10->n_phone;
                  if (0 < (long)iVar8) {
                    iVar9 = pmVar10->n_emit_state;
                    ppVar14 = pmVar10->phone;
                    lVar24 = 0;
                    do {
                      *(s3senid_t **)((long)&ppVar14->state + lVar24) = psVar16;
                      psVar16 = psVar16 + iVar9;
                      lVar24 = lVar24 + 0x20;
                    } while ((long)iVar8 * 0x20 != lVar24);
                  }
                  ppppVar17 = (ph_lc_t ***)
                              __ckd_calloc_2d__(4,(long)pmVar10->n_ciphone,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                                ,0x314);
                  pmVar10->wpos_ci_lclist = ppppVar17;
                  if (0 < (int)local_c58) {
                    local_c60 = (hash_table_t *)0x0;
LAB_0011537f:
                    do {
                      pcVar11 = fgets(local_c38,0x400,__stream);
                      pmVar10 = local_c68;
                      if (pcVar11 != (char *)0x0) {
                        if (local_c38[0] == '#') goto LAB_0011537f;
                      }
                      if (pcVar11 == (char *)0x0) {
                        pcVar18 = "Premature EOF reading CIphone %d\n";
                        lVar24 = 0x31e;
                        phVar12 = local_c60;
                        goto LAB_00115ca7;
                      }
                      iVar8 = __isoc99_sscanf(local_c38,"%s%n",&local_838,&local_c6c);
                      if (iVar8 != 1) {
                        pcVar11 = "Missing base phone name: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x1ea;
                        goto LAB_00115a9e;
                      }
                      local_c50 = (long)local_c6c;
                      sVar7 = mdef_ciphone_id(pmVar10,(char *)&local_838);
                      phVar12 = local_c60;
                      if (-1 < sVar7) {
                        pcVar11 = "Duplicate base phone: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x1f0;
                        goto LAB_00115a9e;
                      }
                      if ((long)pmVar10->n_ciphone <= (long)local_c60) {
                        __assert_fail("p < m->n_ciphone",
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                      ,0xad,"void ciphone_add(mdef_t *, const char *, s3pid_t)");
                      }
                      pcVar11 = __ckd_salloc__((char *)&local_838,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                               ,0xaf);
                      pmVar10->ciphone[(long)phVar12].name = pcVar11;
                      pcVar11 = (char *)hash_table_enter(pmVar10->ciphone_ht,pcVar11,phVar12);
                      if ((hash_table_t *)pcVar11 != phVar12) {
                        mdeffile = local_c68->ciphone[(long)phVar12].name;
                        pcVar11 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                        lVar24 = 0xb2;
                        goto LAB_00115a9e;
                      }
                      pcVar11 = local_c38 + local_c50;
                      iVar8 = 3;
                      do {
                        iVar9 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&local_c6c);
                        if ((iVar9 != 1) || (CONCAT11(local_838._1_1_,(byte)local_838) != 0x2d)) {
                          pcVar11 = "Bad context info for base phone: %s\n";
                          mdeffile = local_c38;
                          lVar24 = 0x1fa;
                          goto LAB_00115a9e;
                        }
                        pcVar11 = pcVar11 + local_c6c;
                        iVar8 = iVar8 + -1;
                      } while (iVar8 != 0);
                      iVar8 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&local_c6c);
                      phVar12 = local_c60;
                      pmVar10 = local_c68;
                      if (iVar8 != 1) {
                        pcVar11 = "Missing filler atribute field: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x200;
                        goto LAB_00115a9e;
                      }
                      if (local_838._3_4_ == 0x72656c &&
                          CONCAT13(local_838._3_1_,
                                   CONCAT12(local_838._2_1_,
                                            CONCAT11(local_838._1_1_,(byte)local_838))) ==
                          0x6c6c6966) {
                        iVar20 = 1;
                      }
                      else {
                        iVar20 = 0;
                        if (CONCAT13(local_838._3_1_,
                                     CONCAT12(local_838._2_1_,
                                              CONCAT11(local_838._1_1_,(byte)local_838))) !=
                            0x612f6e) {
                          pcVar11 = "Bad filler attribute field: %s\n";
                          mdeffile = local_c38;
                          lVar24 = 0x207;
                          goto LAB_00115a9e;
                        }
                      }
                      local_c68->ciphone[(short)local_c60].filler = iVar20;
                      iVar8 = (int)pcVar11 + local_c6c;
                      sVar22 = (s3pid_t)local_c60;
                      triphone_add(local_c68,(short)local_c60,-1,-1,WORD_POSN_UNDEFINED,sVar22);
                      parse_tmat_senmap(pmVar10,local_c38,iVar8 - (int)local_c38,sVar22);
                      pcVar11 = (char *)((long)phVar12 + 1);
                      pmVar10 = local_c68;
                      local_c60 = (hash_table_t *)pcVar11;
                    } while (pcVar11 != local_c40);
                  }
                  if (pmVar10 == (mdef_t *)0x0) {
                    __assert_fail("m",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                  ,0xf8,"s3cipid_t mdef_ciphone_id(mdef_t *, const char *)");
                  }
                  iVar20 = hash_table_lookup(pmVar10->ciphone_ht,"SIL",(void **)&local_838);
                  sVar7 = -1;
                  if (-1 < iVar20) {
                    sVar7 = CONCAT11(local_838._1_1_,(byte)local_838);
                  }
                  pmVar10->sil = sVar7;
                  if ((int)pcVar11 < pmVar10->n_phone) {
LAB_0011559f:
                    do {
                      pcVar18 = fgets(local_c38,0x400,__stream);
                      if (pcVar18 != (char *)0x0) {
                        if (local_c38[0] == '#') goto LAB_0011559f;
                      }
                      if (pcVar18 == (char *)0x0) {
                        pcVar18 = "Premature EOF reading phone %d\n";
                        lVar24 = 0x326;
                        phVar12 = (hash_table_t *)((ulong)pcVar11 & 0xffffffff);
LAB_00115ca7:
                        err_msg(ERR_FATAL,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                ,lVar24,pcVar18,phVar12);
                        goto LAB_00115aa5;
                      }
                      iVar8 = __isoc99_sscanf(local_c38,"%s%n",&local_838,&local_c6c);
                      if (iVar8 != 1) {
                        pcVar11 = "Missing base phone name: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x21d;
                        goto LAB_00115a9e;
                      }
                      lVar24 = (long)local_c6c;
                      sVar7 = mdef_ciphone_id(local_c68,(char *)&local_838);
                      local_c50 = CONCAT62(local_c50._2_6_,sVar7);
                      if (sVar7 < 0) {
                        pcVar11 = "Unknown base phone: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x222;
                        goto LAB_00115a9e;
                      }
                      pcVar18 = local_c38 + lVar24;
                      iVar8 = __isoc99_sscanf(pcVar18,"%s%n",&local_838,&local_c6c);
                      if (iVar8 != 1) {
                        pcVar11 = "Missing left context: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x226;
                        goto LAB_00115a9e;
                      }
                      lVar24 = (long)local_c6c;
                      local_c52 = mdef_ciphone_id(local_c68,(char *)&local_838);
                      if (local_c52 < 0) {
                        pcVar11 = "Unknown left context: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x22a;
                        goto LAB_00115a9e;
                      }
                      pcVar18 = pcVar18 + lVar24;
                      local_c60 = (hash_table_t *)pcVar11;
                      iVar8 = __isoc99_sscanf(pcVar18,"%s%n",&local_838,&local_c6c);
                      if (iVar8 != 1) {
                        pcVar11 = "Missing right context: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x22e;
                        goto LAB_00115a9e;
                      }
                      lVar24 = (long)local_c6c;
                      sVar7 = mdef_ciphone_id(local_c68,(char *)&local_838);
                      if (sVar7 < 0) {
                        pcVar11 = "Unknown right  context: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x232;
                        goto LAB_00115a9e;
                      }
                      pcVar18 = pcVar18 + lVar24;
                      iVar8 = __isoc99_sscanf(pcVar18,"%s%n",&local_838,&local_c6c);
                      if ((iVar8 != 1) || (local_838._1_1_ != '\0')) {
                        pcVar11 = "Missing or bad word-position spec: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x236;
                        goto LAB_00115a9e;
                      }
                      lVar24 = (long)local_c6c;
                      if ((byte)local_838 < 0x69) {
                        wpos = WORD_POSN_BEGIN;
                        if ((byte)local_838 != 0x62) {
                          if ((byte)local_838 != 0x65) {
LAB_00115ced:
                            pcVar11 = "Bad word-position spec: %s\n";
                            mdeffile = local_c38;
                            lVar24 = 0x246;
                            goto LAB_00115a9e;
                          }
                          wpos = WORD_POSN_END;
                        }
                      }
                      else if ((byte)local_838 == 0x69) {
                        wpos = WORD_POSN_INTERNAL;
                      }
                      else {
                        if ((byte)local_838 != 0x73) goto LAB_00115ced;
                        wpos = WORD_POSN_SINGLE;
                      }
                      iVar8 = __isoc99_sscanf(pcVar18 + lVar24,"%s%n",&local_838,&local_c6c);
                      pmVar10 = local_c68;
                      if (iVar8 != 1) {
                        pcVar11 = "Missing filler attribute field: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x24b;
                        goto LAB_00115a9e;
                      }
                      if (((local_838._3_4_ != 0x72656c ||
                            CONCAT13(local_838._3_1_,
                                     CONCAT12(local_838._2_1_,
                                              CONCAT11(local_838._1_1_,(byte)local_838))) !=
                            0x6c6c6966) ||
                          (local_c68->ciphone[(uint)(int)(short)local_c50].filler == 0)) &&
                         ((CONCAT13(local_838._3_1_,
                                    CONCAT12(local_838._2_1_,
                                             CONCAT11(local_838._1_1_,(byte)local_838))) != 0x612f6e
                          || (local_c68->ciphone[(uint)(int)(short)local_c50].filler != 0)))) {
                        pcVar11 = "Bad filler attribute field: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x252;
                        goto LAB_00115a9e;
                      }
                      iVar8 = (int)(pcVar18 + lVar24) + local_c6c;
                      sVar22 = (s3pid_t)local_c60;
                      triphone_add(local_c68,(short)local_c50,local_c52,sVar7,wpos,sVar22);
                      parse_tmat_senmap(pmVar10,local_c38,iVar8 - (int)local_c38,sVar22);
                      pcVar11 = (char *)(ulong)(sVar22 + 1U);
                    } while ((int)(sVar22 + 1U) < pmVar10->n_phone);
                  }
                  do {
                    pcVar18 = fgets(local_c38,0x400,__stream);
                    pcVar11 = local_c40;
                    pmVar10 = local_c68;
                    if (pcVar18 == (char *)0x0) break;
                  } while (local_c38[0] == '#');
                  if (pcVar18 != (char *)0x0) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0x32c,"Non-empty file beyond expected #phones (%d)\n",
                            (ulong)(uint)local_c68->n_phone);
                  }
                  if (pmVar10->n_emit_state * pmVar10->n_ciphone == pmVar10->n_ci_sen) {
                    psVar16 = (s3senid_t *)
                              __ckd_calloc__((long)pmVar10->n_sen,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                             ,0x333);
                    pmVar10->cd2cisen = psVar16;
                    __s = (s3cipid_t *)
                          __ckd_calloc__((long)pmVar10->n_sen,2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                         ,0x335);
                    pmVar10->sen2cimap = __s;
                    if (0 < pmVar10->n_sen) {
                      memset(__s,0xff,(ulong)(uint)pmVar10->n_sen * 2);
                    }
                    iVar8 = pmVar10->n_ci_sen;
                    if (0 < (long)iVar8) {
                      psVar16 = pmVar10->cd2cisen;
                      iVar9 = pmVar10->n_emit_state;
                      uVar21 = 0;
                      do {
                        psVar16[uVar21] = (s3senid_t)uVar21;
                        __s[uVar21] = (s3cipid_t)
                                      ((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 |
                                             uVar21 & 0xffffffff) / (long)iVar9);
                        uVar21 = uVar21 + 1;
                      } while ((long)iVar8 != uVar21);
                    }
                    iVar8 = pmVar10->n_phone;
                    if ((int)local_c58 < iVar8) {
                      uVar30 = pmVar10->n_emit_state;
                      do {
                        if (0 < (int)uVar30) {
                          ppsVar15 = pmVar10->sseq;
                          psVar16 = ppsVar15[(long)pcVar11];
                          psVar23 = &pmVar10->phone[(long)pcVar11].ci;
                          psVar4 = pmVar10->cd2cisen;
                          uVar21 = 0;
                          do {
                            sVar1 = psVar16[uVar21];
                            psVar4[sVar1] = ppsVar15[*psVar23][uVar21];
                            __s[sVar1] = *psVar23;
                            uVar21 = uVar21 + 1;
                          } while (uVar30 != uVar21);
                        }
                        pcVar11 = pcVar11 + 1;
                      } while ((int)pcVar11 < iVar8);
                    }
                    iVar9 = pmVar10->n_emit_state;
                    uVar30 = 0;
                    local_c60 = hash_table_new(iVar8,0);
                    len = (size_t)(iVar9 * 2);
                    if (0 < pmVar10->n_phone) {
                      lVar27 = 0;
                      lVar24 = 0;
                      val = (void *)0x0;
                      do {
                        pvVar19 = hash_table_enter_bkey
                                            (local_c60,(char *)pmVar10->sseq[lVar24],len,val);
                        local_838._0_1_ = (byte)pvVar19;
                        local_838._1_1_ = (char)((ulong)pvVar19 >> 8);
                        local_838._2_1_ = (undefined1)((ulong)pvVar19 >> 0x10);
                        local_838._3_1_ = (undefined1)((ulong)pvVar19 >> 0x18);
                        uVar30 = (int)val + (uint)((int)val == (int)pvVar19);
                        val = (void *)(ulong)uVar30;
                        *(int *)((long)&pmVar10->phone->ssid + lVar27) = (int)pvVar19;
                        lVar24 = lVar24 + 1;
                        lVar27 = lVar27 + 0x20;
                      } while (lVar24 < pmVar10->n_phone);
                    }
                    ppsVar15 = (s3senid_t **)
                               __ckd_calloc_2d__((long)(int)uVar30,(long)pmVar10->n_emit_state,2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                                 ,0x277);
                    g = hash_table_tolist(local_c60,(int32 *)&local_838);
                    pgVar6 = g;
                    if (CONCAT13(local_838._3_1_,
                                 CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838))
                                ) != uVar30) {
                      __assert_fail("j == n_sseq",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                    ,0x27a,"void sseq_compress(mdef_t *)");
                    }
                    for (; pgVar6 != (glist_t)0x0; pgVar6 = pgVar6->next) {
                      uVar5 = *(undefined8 *)((long)(pgVar6->data).ptr + 0x10);
                      local_838._0_1_ = (byte)uVar5;
                      local_838._1_1_ = (char)((ulong)uVar5 >> 8);
                      local_838._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
                      local_838._4_3_ = (undefined3)((uint)local_838._3_4_ >> 8);
                      local_838._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
                      memcpy(ppsVar15[(int)uVar5],*(pgVar6->data).ptr,len);
                    }
                    glist_free(g);
                    pmVar10 = local_c68;
                    ckd_free_2d(local_c68->sseq);
                    pmVar10->sseq = ppsVar15;
                    pmVar10->n_sseq = uVar30;
                    hash_table_free(local_c60);
                    fclose(__stream);
                    return pmVar10;
                  }
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                          ,0x332,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                          (ulong)(uint)pmVar10->n_ci_sen,(ulong)(uint)pmVar10->n_ciphone,
                          pmVar10->n_emit_state);
                  goto LAB_00115aa5;
                }
                pcVar11 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
                lVar24 = 0x2ed;
                goto LAB_00115ac2;
              }
              uVar32 = 0x7ffffffe;
              pcVar11 = "%s: #tmats (%d) exceeds limit (%d)\n";
              lVar24 = 0x2e8;
              uVar21 = (ulong)uVar3;
            }
            else {
              uVar32 = 0x7ffe;
              pcVar11 = "%s: #senones (%d) exceeds limit (%d)\n";
              lVar24 = 0x2e5;
            }
          }
          else {
            uVar32 = 0x7ffffffe;
            pcVar11 = "%s: #Phones (%d) exceeds limit (%d)\n";
            lVar24 = 0x2e2;
            uVar21 = (ulong)uVar29;
          }
        }
        else {
          uVar32 = 0x7fff;
          pcVar11 = "%s: #CI phones (%d) exceeds limit (%d)\n";
          lVar24 = 0x2df;
          uVar21 = (ulong)size;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,lVar24,pcVar11,local_c60,uVar21,uVar32);
        goto LAB_00115aa5;
      }
      pcVar11 = "%s: Error in header\n";
      lVar24 = 0x2da;
      mdeffile = (char *)local_c60;
    }
LAB_00115a9e:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar24,pcVar11,mdeffile);
  }
LAB_00115aa5:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(const char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    char tag[1024], buf[1024];
    s3senid_t **senmap;
    /*    s3senid_t *tempsenmap; */

    s3pid_t p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecing %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_S3CIPID)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_S3CIPID);
    if (n_ci + n_tri >= MAX_S3PID)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_S3PID);
    if (m->n_sen >= MAX_S3SENID)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_S3SENID);
    if (m->n_tmat >= MAX_S3TMATID)
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_S3TMATID);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = (s3senid_t **) ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(s3senid_t));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */


    /**CODE DUPLICATION!*****************************************************************************************************/
    /* Flat decoder-specific */
    /* Allocate space for state->senone map for each phone */

    /* ARCHAN 20040820, this sacrifice readability and may cause pointer
       problems in future. However, this is a less evil than
       duplication of code.  This is trick point all the state mapping
       to the global mapping and avoid duplicated memory.  
     */

    /* S3 xwdpid_compress will compress the below list phone list. 
     */

    /* ARCHAN, this part should not be used when one of the recognizer is used. */
    m->st2senmap =
        (s3senid_t *) ckd_calloc(m->n_phone * m->n_emit_state,
                                 sizeof(s3senid_t));
    for (p = 0; p < m->n_phone; p++)
        m->phone[p].state = m->st2senmap + (p * m->n_emit_state);
    /******************************************************************************************************/


    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (s3senid_t *) ckd_calloc(m->n_sen, sizeof(s3senid_t));        /* freed in mdef_free */

    m->sen2cimap = (s3cipid_t *) ckd_calloc(m->n_sen, sizeof(s3cipid_t));       /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = BAD_S3CIPID;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = (s3senid_t) s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[(int) m->phone[p].ci][s];
            m->cd2cisen[cd] = (s3senid_t) ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}